

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O3

UINT8 device_start_ym2413_nuked(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT8 UVar2;
  opll_t *chip;
  DEV_DATA DVar3;
  long lVar4;
  uint uVar5;
  
  uVar1 = cfg->clock;
  if (cfg->srMode == '\x02') {
    uVar5 = cfg->smplRate;
    if (cfg->smplRate < uVar1 / 0x48) {
      uVar5 = uVar1 / 0x48;
    }
  }
  else {
    uVar5 = uVar1 / 0x48;
    if (cfg->srMode == '\x01') {
      uVar5 = cfg->smplRate;
    }
  }
  DVar3.chipInf = calloc(1,0x8200);
  if (DVar3.chipInf == (void *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 8))->chipInf = uVar1;
    *(uint *)((long)DVar3.chipInf + 0xc) = uVar5;
    *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 0x10))->chipInf = cfg->flags & 1;
    lVar4 = 0;
    do {
      *(undefined4 *)
       ((long)DVar3.chipInf + (ulong)*(uint *)((long)MUTE_MASK_MAP + lVar4) * 4 + 0x198) = 0;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x38);
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar5;
    retDevInf->devDef = &devDef_YM2413_Nuked;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_ym2413_nuked(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	opll_t* chip;
	UINT32 rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = (opll_t*)calloc(1, sizeof(opll_t));
	if (chip == NULL)
		return 0xFF;
	
	chip->clock = cfg->clock;
	chip->smplRate = rate; // save for reset
	chip->chip_type = (cfg->flags & 0x01) ? opll_type_ds1001 : opll_type_ym2413;
	nukedopll_set_mute_mask(chip, 0x00);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2413_Nuked);
	return 0x00;
}